

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opencc.c
# Opt level: O0

char * opencc_convert_utf8(opencc_t t_opencc,char *inbuf,size_t length)

{
  ucs4_t *puVar1;
  ucs4_t *puVar2;
  size_t sVar3;
  char *pcVar4;
  char *__n;
  long lVar5;
  size_t sVar6;
  size_t outbuf_offset;
  size_t ubuff_len;
  char *ubuff;
  size_t retval;
  size_t outbuf_left;
  size_t inbuf_left;
  ucs4_t *poutbuf;
  ucs4_t *pinbuf;
  ucs4_t *woutbuf;
  size_t wbufsize;
  char *outbuf;
  char *original_outbuf;
  size_t outsize;
  size_t outbuf_len;
  ucs4_t *winbuf;
  size_t length_local;
  char *inbuf_local;
  opencc_t t_opencc_local;
  
  winbuf = (ucs4_t *)length;
  length_local = (size_t)inbuf;
  inbuf_local = (char *)t_opencc;
  if (lib_initialized == 0) {
    lib_initialize();
  }
  puVar1 = winbuf;
  if ((winbuf == (ucs4_t *)0xffffffffffffffff) ||
     (puVar2 = (ucs4_t *)strlen((char *)length_local), puVar2 < puVar1)) {
    winbuf = (ucs4_t *)strlen((char *)length_local);
  }
  outbuf_len = (size_t)utf8_to_ucs4((char *)length_local,(size_t)winbuf);
  if ((ucs4_t *)outbuf_len == (ucs4_t *)0xffffffffffffffff) {
    errnum = OPENCC_ERROR_ENCODIND;
    t_opencc_local = (opencc_t)0xffffffffffffffff;
  }
  else {
    outsize = (size_t)winbuf;
    original_outbuf = (char *)winbuf;
    wbufsize = (size_t)malloc((long)winbuf + 1);
    *(char *)wbufsize = '\0';
    woutbuf = winbuf + 0x10;
    outbuf = (char *)wbufsize;
    inbuf_left = (size_t)malloc(((long)winbuf + 0x41) * 4);
    poutbuf = (ucs4_t *)outbuf_len;
    pinbuf = (ucs4_t *)inbuf_left;
    outbuf_left = ucs4len((ucs4_t *)outbuf_len);
    while (retval = (size_t)woutbuf, outbuf_left != 0) {
      sVar3 = opencc_convert(inbuf_local,&poutbuf,&outbuf_left,(ucs4_t **)&inbuf_left,&retval);
      if (sVar3 == 0xffffffffffffffff) {
        free((void *)wbufsize);
        free((void *)outbuf_len);
        free(pinbuf);
        return (char *)0xffffffffffffffff;
      }
      *(undefined4 *)inbuf_left = 0;
      pcVar4 = ucs4_to_utf8(pinbuf,0xffffffffffffffff);
      if (pcVar4 == (char *)0xffffffffffffffff) {
        free((void *)wbufsize);
        free((void *)outbuf_len);
        free(pinbuf);
        errnum = OPENCC_ERROR_ENCODIND;
        return (char *)0xffffffffffffffff;
      }
      __n = (char *)strlen(pcVar4);
      while (original_outbuf < __n) {
        lVar5 = wbufsize - (long)outbuf;
        original_outbuf = original_outbuf + outsize;
        outsize = outsize * 2;
        outbuf = (char *)realloc(outbuf,outsize);
        wbufsize = (size_t)(outbuf + lVar5);
      }
      strncpy((char *)wbufsize,pcVar4,(size_t)__n);
      free(pcVar4);
      wbufsize = (size_t)(__n + wbufsize);
      *(char *)wbufsize = '\0';
      inbuf_left = (size_t)pinbuf;
    }
    free((void *)outbuf_len);
    free(pinbuf);
    pcVar4 = outbuf;
    sVar6 = strlen(outbuf);
    t_opencc_local = realloc(pcVar4,sVar6 + 1);
  }
  return (char *)t_opencc_local;
}

Assistant:

char * opencc_convert_utf8(opencc_t t_opencc, const char * inbuf, size_t length)
{
	if (!lib_initialized)
		lib_initialize();

	if (length == (size_t) -1 || length > strlen(inbuf))
		length = strlen(inbuf);

	/* 將輸入數據轉換爲ucs4_t字符串 */
	ucs4_t * winbuf = utf8_to_ucs4(inbuf, length);
	if (winbuf == (ucs4_t *) -1)
	{
		/* 輸入數據轉換失敗 */
		errnum = OPENCC_ERROR_ENCODIND;
		return (char *) -1;
	}

	/* 設置輸出UTF8文本緩衝區空間 */
	size_t outbuf_len = length;
	size_t outsize = outbuf_len;
	char * original_outbuf = (char *) malloc(sizeof(char) * (outbuf_len + 1));
	char * outbuf = original_outbuf;
	original_outbuf[0] = '\0';

	/* 設置轉換緩衝區空間 */
	size_t wbufsize = length + 64;
	ucs4_t * woutbuf = (ucs4_t *) malloc(sizeof(ucs4_t) * (wbufsize + 1));

	ucs4_t * pinbuf = winbuf;
	ucs4_t * poutbuf = woutbuf;
	size_t inbuf_left, outbuf_left;

	inbuf_left = ucs4len(winbuf);
	outbuf_left = wbufsize;

	while (inbuf_left > 0)
	{
		size_t retval = opencc_convert(t_opencc, &pinbuf, &inbuf_left, &poutbuf, &outbuf_left);
		if (retval == (size_t) -1)
		{
			free(outbuf);
			free(winbuf);
			free(woutbuf);
			return (char *) -1;
		}

		*poutbuf = L'\0';

		char * ubuff = ucs4_to_utf8(woutbuf, (size_t) -1);

		if (ubuff == (char *) -1)
		{
			free(outbuf);
			free(winbuf);
			free(woutbuf);
			errnum = OPENCC_ERROR_ENCODIND;
			return (char *) -1;
		}

		size_t ubuff_len = strlen(ubuff);

		while (ubuff_len > outsize)
		{
			size_t outbuf_offset = outbuf - original_outbuf;
			outsize += outbuf_len;
			outbuf_len += outbuf_len;
			original_outbuf = (char *) realloc(original_outbuf, sizeof(char) * outbuf_len);
			outbuf = original_outbuf + outbuf_offset;
		}

		strncpy(outbuf, ubuff, ubuff_len);
		free(ubuff);

		outbuf += ubuff_len;
		*outbuf = '\0';

		outbuf_left = wbufsize;
		poutbuf = woutbuf;
	}

	free(winbuf);
	free(woutbuf);

	original_outbuf = (char *) realloc(original_outbuf,
			sizeof(char) * (strlen(original_outbuf) + 1));

	return original_outbuf;
}